

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O3

Gia_Sim2_t * Gia_Sim2Create(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  Gia_Sim2_t *p;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  int level;
  size_t __size;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  p = (Gia_Sim2_t *)calloc(1,0x30);
  p->pAig = pAig;
  p->pPars = pPars;
  iVar1 = pPars->nWords;
  p->nWords = iVar1;
  iVar2 = pAig->nObjs;
  __size = (long)(iVar2 * iVar1) << 2;
  puVar5 = (uint *)malloc(__size);
  p->pDataSim = puVar5;
  if (puVar5 == (uint *)0x0) {
    Abc_Print((int)__size,"Simulator could not allocate %.2f GB for simulation info.\n",
              (double)iVar2 * (double)iVar1 * 4.0 * 9.313225746154785e-10);
    Gia_Sim2Delete(p);
    p = (Gia_Sim2_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    p->vClassOld = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    level = 400;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    p->vClassNew = pVVar6;
    if (pPars->fVerbose != 0) {
      Abc_Print(level,"Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n",
                (double)iVar2 * 12.0 * 9.5367431640625e-07,
                (double)iVar1 * 4.0 * (double)iVar2 * 9.5367431640625e-07);
    }
    Gia_ManSetPhase(pAig);
    auVar4 = _DAT_0093d220;
    uVar3 = pAig->nObjs;
    if ((0 < (int)uVar3) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      lVar8 = (ulong)uVar3 - 1;
      auVar10._8_4_ = (int)lVar8;
      auVar10._0_8_ = lVar8;
      auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
      puVar5 = &pAig->pObjs->Value;
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_0093d220;
      auVar11 = _DAT_0093d210;
      do {
        auVar12 = auVar11 ^ auVar4;
        if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                    auVar10._4_4_ < auVar12._4_4_) & 1)) {
          *puVar5 = (uint)uVar9;
        }
        if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
            auVar12._12_4_ <= auVar10._12_4_) {
          puVar5[3] = (uint)uVar9 + 1;
        }
        uVar9 = uVar9 + 2;
        lVar8 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar8 + 2;
        puVar5 = puVar5 + 6;
      } while ((uVar3 + 1 & 0xfffffffe) != uVar9);
    }
  }
  return p;
}

Assistant:

Gia_Sim2_t * Gia_Sim2Create( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Gia_Sim2_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nWords    = pPars->nWords;
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWords * Gia_ManObjNum(p->pAig) );
    if ( !p->pDataSim  )
    { 
        Abc_Print( 1, "Simulator could not allocate %.2f GB for simulation info.\n", 
            4.0 * p->nWords * Gia_ManObjNum(p->pAig) / (1<<30) );
        Gia_Sim2Delete( p );
        return NULL;
    }
    p->vClassOld = Vec_IntAlloc( 100 );
    p->vClassNew = Vec_IntAlloc( 100 );
    if ( pPars->fVerbose )
        Abc_Print( 1, "Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 4.0*p->nWords*Gia_ManObjNum(p->pAig)/(1<<20) );
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManForEachObj( pAig, pObj, i )
        pObj->Value = i;
    return p;
}